

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miner_tests.cpp
# Opt level: O2

bool __thiscall
miner_tests::MinerTestingSetup::TestSequenceLocks
          (MinerTestingSetup *this,CTransaction *tx,CTxMemPool *tx_mempool)

{
  pointer ppCVar1;
  bool bVar2;
  Chainstate *pCVar3;
  CCoinsViewCache *baseIn;
  CBlockIndex *tip;
  long in_FS_OFFSET;
  CCoinsViewMemPool view_mempool;
  optional<LockPoints> lock_points;
  CCoinsViewMemPool CStack_e8;
  optional<LockPoints> local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar3 = ChainstateManager::ActiveChainstate
                     ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                      m_node.chainman._M_t.
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  baseIn = Chainstate::CoinsTip(pCVar3);
  CCoinsViewMemPool::CCoinsViewMemPool(&CStack_e8,(CCoinsView *)baseIn,tx_mempool);
  pCVar3 = ChainstateManager::ActiveChainstate
                     ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                      m_node.chainman._M_t.
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ppCVar1 = (pCVar3->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar1 ==
      (pCVar3->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    tip = (CBlockIndex *)0x0;
  }
  else {
    tip = ppCVar1[-1];
  }
  CalculateLockPointsAtTip(&local_40,tip,(CCoinsView *)&CStack_e8,tx);
  if (local_40.super__Optional_base<LockPoints,_true,_true>._M_payload.
      super__Optional_payload_base<LockPoints>._M_engaged == true) {
    bVar2 = CheckSequenceLocksAtTip(tip,(LockPoints *)&local_40);
  }
  else {
    bVar2 = false;
  }
  CCoinsViewMemPool::~CCoinsViewMemPool(&CStack_e8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(::cs_main)
    {
        CCoinsViewMemPool view_mempool{&m_node.chainman->ActiveChainstate().CoinsTip(), tx_mempool};
        CBlockIndex* tip{m_node.chainman->ActiveChain().Tip()};
        const std::optional<LockPoints> lock_points{CalculateLockPointsAtTip(tip, view_mempool, tx)};
        return lock_points.has_value() && CheckSequenceLocksAtTip(tip, *lock_points);
    }